

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O1

bool __thiscall reflection::Type::Verify(Type *this,Verifier *verifier)

{
  bool bVar1;
  long lVar2;
  unsigned_short vtsize;
  ushort uVar3;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if (bVar1) {
    lVar2 = -(long)*(int *)this;
    if (*(ushort *)(this + -(long)*(int *)this) < 5) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(this + lVar2 + 4);
    }
    if (uVar3 != 0) {
      if (verifier->size_ < 2) {
        return false;
      }
      if ((Type *)(verifier->size_ - 1) < this + ((ulong)uVar3 - (long)verifier->buf_)) {
        return false;
      }
    }
    if (*(ushort *)(this + -(long)*(int *)this) < 7) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(this + lVar2 + 6);
    }
    if (uVar3 != 0) {
      if (verifier->size_ < 2) {
        return false;
      }
      if ((Type *)(verifier->size_ - 1) < this + ((ulong)uVar3 - (long)verifier->buf_)) {
        return false;
      }
    }
    bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,8,4);
    if ((((bVar1) &&
         (bVar1 = flatbuffers::Table::VerifyField<unsigned_short>(&this->super_Table,verifier,10,2),
         bVar1)) &&
        (bVar1 = flatbuffers::Table::VerifyField<unsigned_int>(&this->super_Table,verifier,0xc,4),
        bVar1)) &&
       (bVar1 = flatbuffers::Table::VerifyField<unsigned_int>(&this->super_Table,verifier,0xe,4),
       bVar1)) {
      verifier->depth_ = verifier->depth_ - 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<int8_t>(verifier, VT_BASE_TYPE, 1) &&
           VerifyField<int8_t>(verifier, VT_ELEMENT, 1) &&
           VerifyField<int32_t>(verifier, VT_INDEX, 4) &&
           VerifyField<uint16_t>(verifier, VT_FIXED_LENGTH, 2) &&
           VerifyField<uint32_t>(verifier, VT_BASE_SIZE, 4) &&
           VerifyField<uint32_t>(verifier, VT_ELEMENT_SIZE, 4) &&
           verifier.EndTable();
  }